

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

size_t DataValue_calcSizeBinary(UA_DataValue *src,UA_DataType *_)

{
  byte bVar1;
  size_t sVar2;
  long lVar3;
  
  bVar1 = *(byte *)src;
  if ((bVar1 & 1) == 0) {
    lVar3 = 1;
  }
  else {
    sVar2 = Variant_calcSizeBinary(&src->value,_);
    lVar3 = sVar2 + 1;
    bVar1 = *(byte *)src;
  }
  return (ulong)(bVar1 >> 4 & 2) +
         (ulong)(bVar1 & 8) + lVar3 + (ulong)(bVar1 * '\x02' & 4) +
         (ulong)(bVar1 >> 3 & 2) + (ulong)(bVar1 * '\x02' & 8);
}

Assistant:

static size_t
DataValue_calcSizeBinary(const UA_DataValue *src, UA_DataType *_) {
    size_t s = 1; // encoding byte
    if(src->hasValue)
        s += Variant_calcSizeBinary(&src->value, NULL);
    if(src->hasStatus)
        s += 4;
    if(src->hasSourceTimestamp)
        s += 8;
    if(src->hasSourcePicoseconds)
        s += 2;
    if(src->hasServerTimestamp)
        s += 8;
    if(src->hasServerPicoseconds)
        s += 2;
    return s;
}